

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul_x86_fma.cpp
# Opt level: O0

int __thiscall ncnn::MatMul_x86_fma::create_pipeline(MatMul_x86_fma *this,Option *opt)

{
  ParamDictPrivate *pPVar1;
  Layer *pLVar2;
  undefined8 in_RSI;
  ParamDict *in_RDI;
  ParamDict pd;
  undefined8 in_stack_ffffffffffffffb8;
  ParamDict *this_00;
  undefined1 local_40 [8];
  Mat *in_stack_ffffffffffffffc8;
  ParamDict *in_stack_ffffffffffffffd0;
  ParamDict local_20;
  undefined8 local_10;
  
  local_10 = in_RSI;
  pLVar2 = create_layer((int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  in_RDI->d = (ParamDictPrivate *)pLVar2;
  this_00 = &local_20;
  ParamDict::ParamDict(in_stack_ffffffffffffffd0);
  ParamDict::set(this_00,2,0);
  ParamDict::set(&local_20,3,
                 *(int *)(((ModelBin *)&in_RDI->_vptr_ParamDict)->_vptr_ModelBin[-3] +
                         (long)&((ModelBin *)&in_RDI[0xd]._vptr_ParamDict)->_vptr_ModelBin));
  ParamDict::set(&local_20,4,0);
  ParamDict::set(&local_20,5,0);
  ParamDict::set(&local_20,6,1);
  ParamDict::set(&local_20,7,0);
  ParamDict::set(&local_20,8,0);
  ParamDict::set(&local_20,9,0);
  ParamDict::set(&local_20,10,-1);
  ParamDict::set(&local_20,0xb,0);
  ParamDict::set(&local_20,0xc,1);
  (*(code *)(*(Mat **)in_RDI->d->params)->elemsize)(in_RDI->d,&local_20);
  pPVar1 = in_RDI->d;
  ModelBinFromMatArray::ModelBinFromMatArray
            ((ModelBinFromMatArray *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  (**(code **)&(*(Mat **)pPVar1->params)->elempack)(pPVar1,local_40);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_RDI);
  (*(code *)(*(Mat **)in_RDI->d->params)->allocator)(in_RDI->d,local_10);
  ParamDict::~ParamDict(in_RDI);
  return 0;
}

Assistant:

int MatMul_x86_fma::create_pipeline(const Option& opt)
{
    gemm = ncnn::create_layer(ncnn::LayerType::Gemm);

    ncnn::ParamDict pd;
    pd.set(2, 0);      // transA
    pd.set(3, transB); // transB
    pd.set(4, 0);      // constantA
    pd.set(5, 0);      // constantB
    pd.set(6, 1);      // constantC
    pd.set(7, 0);      // M = outch
    pd.set(8, 0);      // N = size
    pd.set(9, 0);      // K = maxk*inch
    pd.set(10, -1);    // constant_broadcast_type_C = null
    pd.set(11, 0);     // output_N1M
    pd.set(12, 1);     // output_elempack

    gemm->load_param(pd);

    gemm->load_model(ModelBinFromMatArray(0));

    gemm->create_pipeline(opt);

    return 0;
}